

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newmem.c
# Opt level: O0

void free_pstring(char *pstr)

{
  char *in_RDI;
  
  if (((in_RDI != (char *)0x0) && (in_RDI != str_empty)) &&
     (nAllocString = nAllocString + -1, in_RDI != (char *)0x0)) {
    operator_delete__(in_RDI);
  }
  return;
}

Assistant:

void free_pstring(char *pstr)
{
//	RS.Logger.Info("Trying to free {} : {}.",pstr,(long)pstr);
//	if(pstr == nullptr)
//		RS.Logger.Debug("Error: Trying to free null pstring.");
	if(pstr == nullptr 
         ||   pstr == &str_empty[0]) 
                return;
	nAllocString--;
//	sAllocString -= strlen(pstr);
	delete[] pstr;
}